

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx2_gemm.h
# Opt level: O0

void intgemm::AVX2::Kernels16::Quantize(float *input,int16_t *output,float quant_mult,Index size)

{
  FRegister mult_reg;
  long lVar1;
  uint in_EDX;
  undefined8 *in_RSI;
  long in_RDI;
  uint in_XMM0_Da;
  undefined8 uVar2;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar3 [32];
  undefined8 uVar6;
  float *end;
  FRegister q;
  float in_stack_ffffffffffffff30;
  float *in_stack_ffffffffffffff70;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uStack_68;
  undefined8 *local_40;
  long local_38;
  
  auVar3 = ZEXT432(in_XMM0_Da);
  set1_ps<float__vector(8)>(in_stack_ffffffffffffff30);
  uStack_68 = auVar3._24_8_;
  lVar1 = in_RDI + (ulong)in_EDX * 4;
  uVar2 = auVar3._0_8_;
  uVar4 = auVar3._8_8_;
  uVar5 = auVar3._16_8_;
  local_40 = in_RSI;
  for (local_38 = in_RDI; local_38 != lVar1; local_38 = local_38 + 0x40) {
    mult_reg[2] = (float)(int)uVar2;
    mult_reg[3] = (float)(int)((ulong)uVar2 >> 0x20);
    mult_reg[0] = (float)(int)lVar1;
    mult_reg[1] = (float)(int)((ulong)lVar1 >> 0x20);
    mult_reg[4] = (float)(int)uVar4;
    mult_reg[5] = (float)(int)((ulong)uVar4 >> 0x20);
    mult_reg[6] = (float)(int)uVar5;
    mult_reg[7] = (float)(int)((ulong)uVar5 >> 0x20);
    uVar6 = uStack_68;
    uVar7 = uVar2;
    uVar8 = uVar4;
    uVar9 = uVar5;
    QuantizeTile16::Consecutive(mult_reg,in_stack_ffffffffffffff70);
    *local_40 = uVar2;
    local_40[1] = uVar4;
    local_40[2] = uVar5;
    local_40[3] = uVar6;
    local_40 = local_40 + 4;
    uVar2 = uVar7;
    uVar4 = uVar8;
    uVar5 = uVar9;
  }
  return;
}

Assistant:

INTGEMM_AVX2 static void Quantize(const float *input, int16_t *output, float quant_mult, Index size) {
    assert(size % 16 == 0);
    assert(reinterpret_cast<uintptr_t>(input) % 32 == 0);
    FRegister q = set1_ps<FRegister>(quant_mult);
    const float *end = input + size;
    for (; input != end; input += 16, output += 16) {
      *reinterpret_cast<__m256i*>(output) = QuantizeTile16::Consecutive(q, input);
    }
  }